

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolynomialFDS.cpp
# Opt level: O0

vector<ComponentData,_std::allocator<ComponentData>_> *
computeComponentsAndCycles
          (vector<ComponentData,_std::allocator<ComponentData>_> *__return_storage_ptr__,
          vector<long,_std::allocator<long>_> *stateSpace)

{
  long lVar1;
  size_type sVar2;
  reference pvVar3;
  const_reference pvVar4;
  size_type *psVar5;
  reference pvVar6;
  size_type local_b8;
  long q;
  long pt_1;
  long j_1;
  long i_1;
  size_type local_90;
  long j;
  long thisLimtCycle;
  long pt;
  long i;
  long nextIndex;
  vector<long,_std::allocator<long>_> limitCycles;
  allocator<long> local_39;
  value_type_conflict3 local_38;
  undefined1 local_30 [8];
  vector<long,_std::allocator<long>_> cycle;
  vector<long,_std::allocator<long>_> *stateSpace_local;
  vector<ComponentData,_std::allocator<ComponentData>_> *result;
  
  cycle.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)stateSpace;
  sVar2 = Catch::clara::std::vector<long,_std::allocator<long>_>::size
                    ((vector<long,_std::allocator<long>_> *)stateSpace);
  local_38 = -1;
  Catch::clara::std::allocator<long>::allocator(&local_39);
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)local_30,sVar2,&local_38,&local_39);
  Catch::clara::std::allocator<long>::~allocator(&local_39);
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)&nextIndex);
  i = 0;
  for (pt = 0; lVar1 = pt,
      sVar2 = Catch::clara::std::vector<long,_std::allocator<long>_>::size
                        ((vector<long,_std::allocator<long>_> *)
                         cycle.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage), (ulong)lVar1 < sVar2;
      pt = pt + 1) {
    pvVar3 = std::vector<long,_std::allocator<long>_>::operator[]
                       ((vector<long,_std::allocator<long>_> *)local_30,pt);
    if (*pvVar3 < 0) {
      thisLimtCycle = pt;
      while (pvVar3 = std::vector<long,_std::allocator<long>_>::operator[]
                                ((vector<long,_std::allocator<long>_> *)local_30,thisLimtCycle),
            lVar1 = i, *pvVar3 == -1) {
        pvVar3 = std::vector<long,_std::allocator<long>_>::operator[]
                           ((vector<long,_std::allocator<long>_> *)local_30,thisLimtCycle);
        *pvVar3 = lVar1;
        pvVar4 = std::vector<long,_std::allocator<long>_>::operator[]
                           ((vector<long,_std::allocator<long>_> *)
                            cycle.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,thisLimtCycle);
        thisLimtCycle = *pvVar4;
      }
      pvVar3 = std::vector<long,_std::allocator<long>_>::operator[]
                         ((vector<long,_std::allocator<long>_> *)local_30,thisLimtCycle);
      if (*pvVar3 == i) {
        std::vector<long,_std::allocator<long>_>::push_back
                  ((vector<long,_std::allocator<long>_> *)&nextIndex,&thisLimtCycle);
        i = i + 1;
      }
      else {
        pvVar3 = std::vector<long,_std::allocator<long>_>::operator[]
                           ((vector<long,_std::allocator<long>_> *)local_30,thisLimtCycle);
        j = *pvVar3;
        local_90 = pt;
        while (lVar1 = j, local_90 != thisLimtCycle) {
          pvVar3 = std::vector<long,_std::allocator<long>_>::operator[]
                             ((vector<long,_std::allocator<long>_> *)local_30,local_90);
          *pvVar3 = lVar1;
          psVar5 = (size_type *)
                   std::vector<long,_std::allocator<long>_>::operator[]
                             ((vector<long,_std::allocator<long>_> *)
                              cycle.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage,local_90);
          local_90 = *psVar5;
        }
      }
    }
  }
  i_1._7_1_ = 0;
  sVar2 = Catch::clara::std::vector<long,_std::allocator<long>_>::size
                    ((vector<long,_std::allocator<long>_> *)&nextIndex);
  std::allocator<ComponentData>::allocator((allocator<ComponentData> *)((long)&i_1 + 6));
  std::vector<ComponentData,_std::allocator<ComponentData>_>::vector
            (__return_storage_ptr__,sVar2,(allocator<ComponentData> *)((long)&i_1 + 6));
  std::allocator<ComponentData>::~allocator((allocator<ComponentData> *)((long)&i_1 + 6));
  for (j_1 = 0; lVar1 = j_1,
      sVar2 = Catch::clara::std::vector<long,_std::allocator<long>_>::size
                        ((vector<long,_std::allocator<long>_> *)local_30), (ulong)lVar1 < sVar2;
      j_1 = j_1 + 1) {
    psVar5 = (size_type *)
             std::vector<long,_std::allocator<long>_>::operator[]
                       ((vector<long,_std::allocator<long>_> *)local_30,j_1);
    pvVar6 = std::vector<ComponentData,_std::allocator<ComponentData>_>::operator[]
                       (__return_storage_ptr__,*psVar5);
    pvVar6->componentSize = pvVar6->componentSize + 1;
  }
  for (pt_1 = 0; lVar1 = pt_1,
      sVar2 = Catch::clara::std::vector<long,_std::allocator<long>_>::size
                        ((vector<long,_std::allocator<long>_> *)&nextIndex), (ulong)lVar1 < sVar2;
      pt_1 = pt_1 + 1) {
    pvVar3 = std::vector<long,_std::allocator<long>_>::operator[]
                       ((vector<long,_std::allocator<long>_> *)&nextIndex,pt_1);
    q = *pvVar3;
    pvVar6 = std::vector<ComponentData,_std::allocator<ComponentData>_>::operator[]
                       (__return_storage_ptr__,pt_1);
    std::vector<long,_std::allocator<long>_>::push_back(&pvVar6->limitCycle,&q);
    psVar5 = (size_type *)
             std::vector<long,_std::allocator<long>_>::operator[]
                       ((vector<long,_std::allocator<long>_> *)
                        cycle.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,q);
    local_b8 = *psVar5;
    while (local_b8 != q) {
      pvVar6 = std::vector<ComponentData,_std::allocator<ComponentData>_>::operator[]
                         (__return_storage_ptr__,pt_1);
      std::vector<long,_std::allocator<long>_>::push_back
                (&pvVar6->limitCycle,(value_type_conflict3 *)&local_b8);
      psVar5 = (size_type *)
               std::vector<long,_std::allocator<long>_>::operator[]
                         ((vector<long,_std::allocator<long>_> *)
                          cycle.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,local_b8);
      local_b8 = *psVar5;
    }
  }
  i_1._7_1_ = 1;
  Catch::clara::std::vector<long,_std::allocator<long>_>::~vector
            ((vector<long,_std::allocator<long>_> *)&nextIndex);
  Catch::clara::std::vector<long,_std::allocator<long>_>::~vector
            ((vector<long,_std::allocator<long>_> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

std::vector<ComponentData> computeComponentsAndCycles(const std::vector<long>& stateSpace)
{
  // cycle[0..N-1] starts out with all -1's, and then each -1 is eventually replaced with the
  //   index of the limit cycle that state goes to (N = stateSpace.size()
  std::vector<long> cycle(stateSpace.size(), -1);

  // A growing array, the length is the number of limit cycles found so far
  std::vector<long> limitCycles; // limitCycles[i] is a state in the i-th limit cycle.

  long nextIndex = 0;
  for (long i = 0; i < stateSpace.size(); ++i)
    {
      if (cycle[i] >= 0) continue;
      long pt = i;
      while (cycle[pt] == -1)
        {
          cycle[pt] = nextIndex;
          pt = stateSpace[pt];
        }
      if (cycle[pt] == nextIndex)
        {
          limitCycles.push_back(pt);
          nextIndex++; // note nextIndex is always limitCycles.size() (as a long).
        }
      else
        {
          long thisLimtCycle = cycle[pt];
          long j = i;
          while (j != pt)
            {
              cycle[j] = thisLimtCycle;
              j = stateSpace[j];
            }
        }
    }

  // This contains the component info, and each limit cycle
  std::vector<ComponentData> result(limitCycles.size());

  // fill in the component sizes of each component
  for (long i = 0; i < cycle.size(); ++i)
    {
      result[cycle[i]].componentSize++;
    }

  for (long j = 0; j < limitCycles.size(); j++)
    {
      long pt = limitCycles[j];
      result[j].limitCycle.push_back(pt);
      long q = stateSpace[pt];
      while (q != pt)
        {
          result[j].limitCycle.push_back(q);
          q = stateSpace[q];
        }
    }
  return result;
}